

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::on_files_deleted(torrent *this,storage_error *error)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> args_1;
  bool bVar1;
  alert_manager *paVar2;
  element_type *peVar3;
  info_hash_t *piVar4;
  undefined1 local_48 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  storage_error *error_local;
  torrent *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error;
  error_local = (storage_error *)this;
  bVar1 = storage_error::operator_cast_to_bool(error);
  if (bVar1) {
    paVar2 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::torrent_delete_failed_alert>(paVar2);
    if (bVar1) {
      paVar2 = alerts(this);
      get_handle((torrent *)&stack0xffffffffffffffc8);
      args_1._M_pi = local_18._M_pi;
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      piVar4 = torrent_info::info_hashes(peVar3);
      alert_manager::
      emplace_alert<libtorrent::torrent_delete_failed_alert,libtorrent::torrent_handle,boost::system::error_code_const&,libtorrent::info_hash_t_const&>
                (paVar2,(torrent_handle *)&stack0xffffffffffffffc8,(error_code *)args_1._M_pi,piVar4
                );
      torrent_handle::~torrent_handle((torrent_handle *)&stack0xffffffffffffffc8);
    }
  }
  else {
    paVar2 = alerts(this);
    get_handle((torrent *)local_48);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    piVar4 = torrent_info::info_hashes(peVar3);
    alert_manager::
    emplace_alert<libtorrent::torrent_deleted_alert,libtorrent::torrent_handle,libtorrent::info_hash_t_const&>
              (paVar2,(torrent_handle *)local_48,piVar4);
    torrent_handle::~torrent_handle((torrent_handle *)local_48);
  }
  return;
}

Assistant:

void torrent::on_files_deleted(storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		if (error)
		{
			if (alerts().should_post<torrent_delete_failed_alert>())
				alerts().emplace_alert<torrent_delete_failed_alert>(get_handle()
					, error.ec, m_torrent_file->info_hashes());
		}
		else
		{
			alerts().emplace_alert<torrent_deleted_alert>(get_handle(), m_torrent_file->info_hashes());
		}
	}
	catch (...) { handle_exception(); }